

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O2

bool common::OnlyHasDefaultSectionSetting(Settings *settings,string *section,string *name)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  long in_FS_OFFSET;
  SettingsSpan span;
  SettingsSpan span_00;
  anon_class_16_2_14b99272 local_70;
  bool has_other_setting;
  bool has_default_section_setting;
  SettingsSpan local_58;
  SettingsSpan local_48;
  SettingsSpan local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_70.has_default_section_setting = &has_default_section_setting;
  has_default_section_setting = false;
  local_70.has_other_setting = &has_other_setting;
  has_other_setting = false;
  pmVar1 = FindKey<std::map<std::__cxx11::string,UniValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,UniValue>>>const&,std::__cxx11::string_const&>
                     (&settings->forced_settings,name);
  if (pmVar1 != (mapped_type *)0x0) {
    span.size = 1;
    span.data = pmVar1;
    OnlyHasDefaultSectionSetting::anon_class_16_2_14b99272::operator()(&local_70,span,FORCED);
  }
  pmVar2 = FindKey<std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>const&,std::__cxx11::string_const&>
                     (&settings->command_line_options,name);
  if (pmVar2 != (mapped_type *)0x0) {
    SettingsSpan::SettingsSpan(&local_38,pmVar2);
    OnlyHasDefaultSectionSetting::anon_class_16_2_14b99272::operator()
              (&local_70,local_38,COMMAND_LINE);
  }
  pmVar1 = FindKey<std::map<std::__cxx11::string,UniValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,UniValue>>>const&,std::__cxx11::string_const&>
                     (&settings->rw_settings,name);
  if (pmVar1 != (mapped_type *)0x0) {
    span_00.size = 1;
    span_00.data = pmVar1;
    OnlyHasDefaultSectionSetting::anon_class_16_2_14b99272::operator()
              (&local_70,span_00,RW_SETTINGS);
  }
  if (section->_M_string_length != 0) {
    pmVar3 = FindKey<std::map<std::__cxx11::string,std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>>>>const&,std::__cxx11::string_const&>
                       (&settings->ro_config,section);
    if (pmVar3 != (mapped_type *)0x0) {
      pmVar2 = FindKey<std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>const&,std::__cxx11::string_const&>
                         (pmVar3,name);
      if (pmVar2 != (mapped_type *)0x0) {
        SettingsSpan::SettingsSpan(&local_48,pmVar2);
        OnlyHasDefaultSectionSetting::anon_class_16_2_14b99272::operator()
                  (&local_70,local_48,CONFIG_FILE_NETWORK_SECTION);
      }
    }
  }
  pmVar3 = FindKey<std::map<std::__cxx11::string,std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>>>>const&,char_const(&)[1]>
                     (&settings->ro_config,(char (*) [1])0xc694e1);
  if (pmVar3 != (mapped_type *)0x0) {
    pmVar2 = FindKey<std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>const&,std::__cxx11::string_const&>
                       (pmVar3,name);
    if (pmVar2 != (mapped_type *)0x0) {
      SettingsSpan::SettingsSpan(&local_58,pmVar2);
      OnlyHasDefaultSectionSetting::anon_class_16_2_14b99272::operator()
                (&local_70,local_58,CONFIG_FILE_DEFAULT_SECTION);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)((has_other_setting ^ 1U) & has_default_section_setting);
  }
  __stack_chk_fail();
}

Assistant:

bool OnlyHasDefaultSectionSetting(const Settings& settings, const std::string& section, const std::string& name)
{
    bool has_default_section_setting = false;
    bool has_other_setting = false;
    MergeSettings(settings, section, name, [&](SettingsSpan span, Source source) {
        if (span.empty()) return;
        else if (source == Source::CONFIG_FILE_DEFAULT_SECTION) has_default_section_setting = true;
        else has_other_setting = true;
    });
    // If a value is set in the default section and not explicitly overwritten by the
    // user on the command line or in a different section, then we want to enable
    // warnings about the value being ignored.
    return has_default_section_setting && !has_other_setting;
}